

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5IndexExtractCol(u8 **pa,int n,int iCol)

{
  uchar uVar1;
  byte bVar2;
  uint in_EAX;
  uint uVar3;
  uchar *p;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  int iCurrent;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  p = *pa;
  puVar5 = p + n;
  iVar4 = 0;
  if (iCol < 1) {
    uVar3 = 0;
    puVar6 = p;
LAB_001a7751:
    iVar4 = 0;
    if (uVar3 == iCol) {
      while ((p < puVar5 && (uVar1 = *p, uVar1 != '\x01'))) {
        while (p = p + 1, (char)uVar1 < '\0') {
          uVar1 = *p;
        }
      }
      iVar4 = (int)p - (int)puVar6;
    }
  }
  else {
    do {
      while( true ) {
        puVar6 = p;
        uVar1 = *puVar6;
        p = puVar6 + 1;
        if (uVar1 != '\x01') break;
        *pa = puVar6;
        bVar2 = puVar6[1];
        uStack_38 = (ulong)CONCAT14(bVar2,(undefined4)uStack_38);
        if ((char)bVar2 < '\0') {
          uVar3 = sqlite3Fts5GetVarint32(p,(u32 *)((long)&uStack_38 + 4));
          p = p + uVar3;
          uVar3 = uStack_38._4_4_;
        }
        else {
          p = puVar6 + 2;
          uVar3 = (uint)bVar2;
        }
        if (iCol <= (int)uVar3) goto LAB_001a7751;
      }
      while ((char)uVar1 < '\0') {
        uVar1 = *p;
        p = p + 1;
      }
    } while (p < puVar5);
  }
  return iVar4;
}

Assistant:

static int fts5IndexExtractCol(
  const u8 **pa,                  /* IN/OUT: Pointer to poslist */
  int n,                          /* IN: Size of poslist in bytes */
  int iCol                        /* Column to extract from poslist */
){
  int iCurrent = 0;               /* Anything before the first 0x01 is col 0 */
  const u8 *p = *pa;
  const u8 *pEnd = &p[n];         /* One byte past end of position list */

  while( iCol>iCurrent ){
    /* Advance pointer p until it points to pEnd or an 0x01 byte that is
    ** not part of a varint. Note that it is not possible for a negative
    ** or extremely large varint to occur within an uncorrupted position 
    ** list. So the last byte of each varint may be assumed to have a clear
    ** 0x80 bit.  */
    while( *p!=0x01 ){
      while( *p++ & 0x80 );
      if( p>=pEnd ) return 0;
    }
    *pa = p++;
    iCurrent = *p++;
    if( iCurrent & 0x80 ){
      p--;
      p += fts5GetVarint32(p, iCurrent);
    }
  }
  if( iCol!=iCurrent ) return 0;

  /* Advance pointer p until it points to pEnd or an 0x01 byte that is
  ** not part of a varint */
  while( p<pEnd && *p!=0x01 ){
    while( *p++ & 0x80 );
  }

  return p - (*pa);
}